

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O0

void __thiscall
cppcms::impl::cgi::fastcgi::on_some_read_from_socket
          (fastcgi *this,error_code *e,size_t read_size,
          callback<void_(const_std::error_code_&,_unsigned_long)> *cb,
          pair<void_*,_unsigned_long> inp)

{
  bool bVar1;
  unsigned_long in_RCX;
  error_code *in_RDX;
  error_code *in_RSI;
  long in_RDI;
  size_t expected_read_size;
  void *ptr;
  io_handler *in_stack_000000b8;
  size_t in_stack_000000c0;
  void *in_stack_000000c8;
  fastcgi *in_stack_000000d0;
  
  *(long *)(in_RDI + 0x1b0) = (long)&in_RDX->_M_value + *(long *)(in_RDI + 0x1b0);
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)in_RSI,in_RDX,in_RCX);
  }
  else {
    async_read_from_socket(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  return;
}

Assistant:

void on_some_read_from_socket(	booster::system::error_code const &e,
						size_t read_size, 
						booster::callback<void(booster::system::error_code const &e,size_t read)> const &cb,
						std::pair<void *,size_t> inp)
		{
			void *ptr = inp.first;
			size_t expected_read_size = inp.second;
			cache_end_ += read_size;
			if(e) {
				cb(e,0);
				return;
			}
			async_read_from_socket(ptr,expected_read_size,cb);
		}